

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void chatra::structureInnerNode
               (IErrorReceiver *errorReceiver,shared_ptr<chatra::StringTable> *sTable,Node *node,
               bool recursive)

{
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *this;
  element_type *peVar1;
  element_type *peVar2;
  pointer ppTVar3;
  Node *pNVar4;
  pointer psVar5;
  Token *pTVar6;
  Token *pTVar7;
  Token *token;
  size_type sVar8;
  iterator iVar9;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  _Var10;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  _Var11;
  size_type sVar12;
  iterator iVar13;
  shared_ptr<chatra::Node> *psVar14;
  NodeType NVar15;
  undefined7 in_register_00000009;
  long lVar16;
  bool bVar17;
  long lVar18;
  const_iterator __last;
  shared_ptr<chatra::Node> *n;
  long lVar19;
  const_iterator cVar20;
  pointer psVar21;
  string *message;
  bool bVar22;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  first;
  undefined1 auVar23 [8];
  bool bVar24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  Token *local_150;
  shared_ptr<chatra::Line> *local_148;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_140;
  const_iterator itForward;
  size_t tokenIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  ParserContext ct;
  undefined1 auStack_88 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Node *local_40;
  NodeState local_38;
  StringId local_34;
  
  ct.sTable._4_4_ = (undefined4)CONCAT71(in_register_00000009,recursive);
  local_a8 = (undefined1  [8])0x0;
  peVar1 = (node->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = peVar1->indents + 1;
  }
  local_148 = &node->line;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this = &node->blockNodes;
  first._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  local_40 = node;
LAB_00178405:
  _Var10._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (first._M_current != _Var10._M_current) {
    peVar1 = ((((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pTVar6 = (peVar1->tokens).super__Vector_base<chatra::Token,_std::allocator<chatra::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (peVar1->indents == local_38) {
      if (pTVar6->type == Name) {
        itForward._M_current = (shared_ptr<chatra::Node> *)0x0;
        local_140._M_current = first._M_current;
        pTVar6 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                           (first,_Var10,&local_140,(size_t *)&itForward);
        pTVar7 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                           (first,(node->blockNodes).
                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_140,
                            (size_t *)&itForward);
        token = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                          (first,(node->blockNodes).
                                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,&local_140,
                           (size_t *)&itForward);
        if (token == (Token *)0x0) {
LAB_001784e5:
          local_34 = Invalid;
        }
        else {
          sVar8 = std::
                  _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)lineTypes,&pTVar6->sid);
          if ((sVar8 != 0) || (pTVar7->sid != Colon)) goto LAB_001784e5;
          local_34 = Invalid;
          if (token->type == Name) {
            local_34 = pTVar6->sid;
            pTVar6 = token;
          }
        }
        iVar9 = std::
                _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)lineTypes,&pTVar6->sid);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
            ._M_cur == (__node_type *)0x0) {
          _Var10._M_current =
               (local_40->blockNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          node = local_40;
          goto LAB_001785f1;
        }
        local_150 = pTVar6;
        _Var10 = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                           (first,(local_40->blockNodes).
                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                            *(bool *)((long)iVar9.
                                            super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                            ._M_cur + 0x11));
        if ((token == (Token *)0x0) || (local_34 == Invalid)) {
LAB_001786b1:
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                             (*(undefined8 *)
                               ((long)iVar9.
                                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                      ._M_cur + 0x18),
                              *(undefined8 *)
                               ((long)iVar9.
                                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                      ._M_cur + 0x20),local_40);
          node = local_40;
          if (_Var11._M_current ==
              *(NodeType **)
               ((long)iVar9.
                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                      ._M_cur + 0x20)) {
            std::__cxx11::string::string
                      ((string *)&local_108,"statement \"",
                       (allocator *)
                       ((long)&outNodes.
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            StringTable::ref_abi_cxx11_
                      (&local_188,(StringTable *)(ct.errorReceiver)->_vptr_IErrorReceiver,
                       pTVar6->sid);
            node = local_40;
            std::operator+(&local_68,&local_108,&local_188);
            std::operator+(&local_e8,&local_68,"\" is not allowed here");
            local_168.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_168.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_168.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_a8,Error,local_150,&local_e8,&local_168);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_168);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_68);
            std::__cxx11::string::~string((string *)&local_188);
            message = &local_108;
LAB_001787c5:
            std::__cxx11::string::~string((string *)message);
            first = _Var10;
          }
          else {
            NVar15 = *(NodeType *)
                      ((long)iVar9.
                             super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                             ._M_cur + 0x10);
            peVar2 = ((first._M_current)->
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            peVar2->type = NVar15;
            if ((pTVar7 == (Token *)0x0) || (NVar15 != Def)) {
              if ((pTVar7 != (Token *)0x0) &&
                 ((NVar15 == Else && (NVar15 = ElseIf, pTVar7->sid == If)))) goto LAB_001787de;
            }
            else {
              NVar15 = DefOperator;
              if (pTVar7->sid == Operator) {
LAB_001787de:
                peVar2->type = NVar15;
              }
            }
            if (*(char *)((long)iVar9.
                                super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                ._M_cur + 0x11) == '\x01') {
              while ((_Var10._M_current !=
                      (node->blockNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish &&
                     (local_38 <
                      (((((_Var10._M_current)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line
                       ).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      indents))) {
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back(&(((first._M_current)->
                              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                             ->blockNodes,_Var10._M_current);
                _Var10._M_current = _Var10._M_current + 1;
              }
            }
            std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)auStack_88,first._M_current);
            first._M_current = _Var10._M_current;
          }
        }
        else {
          peVar2 = ((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          ppTVar3 = (peVar2->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((0x10 < (ulong)((long)(peVar2->tokens).
                                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3)) &&
             (token == ppTVar3[2])) {
            if ((*(byte *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                 ._M_cur + 0x10) & 0xfe) == 0xe) {
              peVar2->sid = local_34;
              goto LAB_001786b1;
            }
            message = &local_e8;
            std::__cxx11::string::string
                      ((string *)message,"only \"for\" or \"while\" can take label",
                       (allocator *)&local_108);
            node = local_40;
            local_68._M_dataplus._M_p = (pointer)0x0;
            local_68._M_string_length = 0;
            local_68.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_a8,Error,token,message,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_68);
            goto LAB_001787c5;
          }
          std::__cxx11::string::string
                    ((string *)&local_e8,
                     "this line seems to be part of wrapping line, but indents may be incorrect",
                     (allocator *)&local_108);
          local_68._M_dataplus._M_p = (pointer)0x0;
          local_68._M_string_length = 0;
          local_68.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_a8,Error,token,&local_e8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68);
          node = local_40;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_68);
          std::__cxx11::string::~string((string *)&local_e8);
          first._M_current =
               local_140._M_current +
               (itForward._M_current != (shared_ptr<chatra::Node> *)0x0 &&
               local_140._M_current !=
               (node->blockNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      else {
LAB_001785f1:
        _Var10 = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                           (first,_Var10,false);
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                           (expressionParentType,DAT_0024f498,node);
        peVar2 = ((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (_Var11._M_current == DAT_0024f498) {
          std::__cxx11::string::string
                    ((string *)&local_e8,"expression is not allowed here",(allocator *)&local_108);
          local_68._M_dataplus._M_p = (pointer)0x0;
          local_68._M_string_length = 0;
          local_68.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtLine
                    ((ParserContext *)local_a8,Error,&peVar2->line,&local_e8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_68);
          std::__cxx11::string::~string((string *)&local_e8);
          first = _Var10;
        }
        else {
          peVar2->type = Expression;
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_88,first._M_current);
          first = _Var10;
        }
      }
      goto LAB_00178405;
    }
    std::__cxx11::string::string
              ((string *)&local_68,"indent mismatch. Expected ${0} indents but ${1} indents found",
               (allocator *)&local_188);
    std::__cxx11::to_string(&local_e8,local_38);
    std::__cxx11::to_string
              (&local_c8,
               (((((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->indents);
    __l._M_len = 2;
    __l._M_array = &local_e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_108,__l,(allocator_type *)&local_168);
    ParserContext::errorAtToken
              ((ParserContext *)local_a8,Error,pTVar6,&local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    lVar19 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_e8._M_dataplus._M_p + lVar19));
      lVar19 = lVar19 + -0x20;
    } while (lVar19 != -0x20);
    std::__cxx11::string::~string((string *)&local_68);
    std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
    clear((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_88);
  }
  sVar12 = std::
           _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::count((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)runnableContainerNodeTypes,&node->type);
  psVar21 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar23 = auStack_88;
  if (sVar12 != 0) {
    do {
      if (auVar23 == (undefined1  [8])psVar21) {
        std::__cxx11::string::string
                  ((string *)&local_e8,"empty block statement",(allocator *)&local_108);
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity = 0;
        ParserContext::errorAtLine
                  ((ParserContext *)local_a8,Warning,local_148,&local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_68);
        std::__cxx11::string::~string((string *)&local_e8);
        break;
      }
      sVar12 = std::
               _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)runnableNodeTypes,
                       &((((shared_ptr<chatra::Node> *)auVar23)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type
                      );
      auVar23 = (undefined1  [8])((long)auVar23 + 0x10);
    } while (sVar12 == 0);
  }
  bVar24 = false;
  local_38 = Structured;
  bVar17 = false;
  bVar22 = false;
  psVar14 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  cVar20._M_current = (shared_ptr<chatra::Node> *)auStack_88;
  do {
    if (cVar20._M_current == psVar14) {
LAB_00178c31:
      if (local_40->type == Switch) {
        bVar24 = false;
        for (cVar20._M_current = (shared_ptr<chatra::Node> *)auStack_88;
            cVar20._M_current !=
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start; cVar20._M_current = cVar20._M_current + 1) {
          peVar2 = ((cVar20._M_current)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          NVar15 = peVar2->type;
          if (NVar15 == Default) {
            bVar24 = true;
          }
          else if (NVar15 == Case) {
            if (bVar24) {
              std::__cxx11::string::string
                        ((string *)&local_e8,"\"case\" cannot be placed after \"default\"",
                         (allocator *)&local_108);
              local_68._M_dataplus._M_p = (pointer)0x0;
              local_68._M_string_length = 0;
              local_68.field_2._M_allocated_capacity = 0;
              ParserContext::errorAtLine
                        ((ParserContext *)local_a8,Error,&peVar2->line,&local_e8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_68);
              std::__cxx11::string::~string((string *)&local_e8);
              std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)auStack_88,cVar20,
                      (const_iterator)
                      outNodes.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
              break;
            }
            bVar24 = false;
          }
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      clear(this);
      psVar21 = outNodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar23 = auStack_88;
      do {
        pNVar4 = local_40;
        if (auVar23 == (undefined1  [8])psVar21) {
          if (ct.sTable._4_1_ != '\0') {
            psVar5 = (local_40->blockNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar21 = (local_40->blockNodes).
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; psVar21 != psVar5;
                psVar21 = psVar21 + 1) {
              recursiveStructureNodes
                        (errorReceiver,sTable,
                         (psVar21->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
            }
          }
          LOCK();
          (pNVar4->blockNodesState)._M_i = local_38;
          UNLOCK();
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_88);
          return;
        }
        pNVar4 = (((value_type *)auVar23)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        NVar15 = pNVar4->type;
        if (NVar15 - 0xc < 2) {
          psVar5 = (local_40->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((local_40->blockNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start == psVar5) ||
             (peVar2 = psVar5[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar2->type != IfGroup)) {
            std::__cxx11::string::string
                      ((string *)&local_e8,"unexpected \"else\" statement",(allocator *)&local_108);
            local_68._M_dataplus._M_p = (pointer)0x0;
            local_68._M_string_length = 0;
            local_68.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtLine
                      ((ParserContext *)local_a8,Error,&pNVar4->line,&local_e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68);
          }
          else {
            if (((peVar2->blockNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type != Else)
            {
              std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::push_back(&peVar2->blockNodes,(value_type *)auVar23);
              goto LAB_00178e61;
            }
            std::__cxx11::string::string
                      ((string *)&local_e8,"extra \"else\" statement",(allocator *)&local_108);
            local_68._M_dataplus._M_p = (pointer)0x0;
            local_68._M_string_length = 0;
            local_68.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtLine
                      ((ParserContext *)local_a8,Error,&pNVar4->line,&local_e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_68);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_68);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        else if (NVar15 == If) {
          local_e8._M_dataplus._M_p = (pointer)0x0;
          local_e8._M_string_length = 0;
          psVar14 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                              (this,(shared_ptr<chatra::Line> *)&local_e8,IfGroup);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&((psVar14->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->blockNodes,(value_type *)auVar23);
          LOCK();
          (((psVar14->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          blockNodesState)._M_i = Structured;
          UNLOCK();
        }
        else {
          if ((NVar15 == Sync) && (ct.sTable._4_1_ == '\0')) {
            structureInnerNode(errorReceiver,sTable,pNVar4,false);
          }
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(this,(value_type *)auVar23);
        }
LAB_00178e61:
        auVar23 = (undefined1  [8])((long)auVar23 + 0x10);
      } while( true );
    }
    peVar2 = ((cVar20._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (bVar17) {
      std::__cxx11::string::string
                ((string *)&local_e8,"nothing can be placed after \"finally\" block",
                 (allocator *)&local_108);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      ParserContext::errorAtLine
                ((ParserContext *)local_a8,Error,&peVar2->line,&local_e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68);
LAB_00178c0c:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      std::__cxx11::string::~string((string *)&local_e8);
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             *)auStack_88,cVar20,
            (const_iterator)
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00178c31;
    }
    NVar15 = peVar2->type;
    if (NVar15 == Catch) {
      bVar17 = false;
LAB_00178a24:
      bVar22 = true;
    }
    else {
      if (NVar15 == Finally) {
        bVar17 = true;
        goto LAB_00178a24;
      }
      if (bVar24) {
        std::__cxx11::string::string((string *)&local_e8,"unreachable code",(allocator *)&local_108)
        ;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        local_68.field_2._M_allocated_capacity = 0;
        ParserContext::errorAtLine
                  ((ParserContext *)local_a8,Warning,&peVar2->line,&local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_68);
        std::__cxx11::string::~string((string *)&local_e8);
        lVar19 = 0x30;
        lVar16 = 0;
        for (lVar18 = (long)outNodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)cVar20._M_current >> 6
            ; 0 < lVar18; lVar18 = lVar18 + -1) {
          if ((**(byte **)((long)&cVar20._M_current[-3].
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + lVar19) & 0xfe) == 0x14) {
            __last._M_current = (shared_ptr<chatra::Node> *)((long)cVar20._M_current - lVar16);
            goto LAB_00178ba0;
          }
          if ((**(byte **)((long)&cVar20._M_current[-2].
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + lVar19) & 0xfe) == 0x14) {
            __last._M_current =
                 (shared_ptr<chatra::Node> *)((long)cVar20._M_current + (0x10 - lVar16));
            goto LAB_00178ba0;
          }
          if ((**(byte **)((long)&cVar20._M_current[-1].
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + lVar19) & 0xfe) == 0x14) {
            __last._M_current =
                 (shared_ptr<chatra::Node> *)((long)cVar20._M_current + (0x20 - lVar16));
            goto LAB_00178ba0;
          }
          if ((**(byte **)((long)&((cVar20._M_current)->
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + lVar19) & 0xfe) == 0x14) {
            __last._M_current =
                 (shared_ptr<chatra::Node> *)((long)cVar20._M_current + (0x30 - lVar16));
            goto LAB_00178ba0;
          }
          lVar16 = lVar16 + -0x40;
          lVar19 = lVar19 + 0x40;
        }
        lVar18 = ((long)outNodes.
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)cVar20._M_current) +
                 lVar16 >> 4;
        psVar14 = (shared_ptr<chatra::Node> *)((long)cVar20._M_current - lVar16);
        if (lVar18 == 1) {
LAB_00178b91:
          __last._M_current = psVar14;
          if ((((psVar14->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               type & ~ScriptRoot) != Catch) {
            __last._M_current =
                 outNodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else if (lVar18 == 3) {
          __last._M_current = psVar14;
          if ((**(byte **)((long)&cVar20._M_current[-3].
                                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + lVar19) & 0xfe) != 0x14) {
            psVar14 = (shared_ptr<chatra::Node> *)((long)cVar20._M_current + (0x10 - lVar16));
            goto LAB_00178b80;
          }
        }
        else {
          __last._M_current =
               outNodes.
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if (lVar18 == 2) {
LAB_00178b80:
            __last._M_current = psVar14;
            if ((((psVar14->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 type & ~ScriptRoot) != Catch) {
              psVar14 = psVar14 + 1;
              goto LAB_00178b91;
            }
          }
        }
LAB_00178ba0:
        iVar13 = std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          *)auStack_88,cVar20,__last);
        if (iVar13._M_current ==
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start) goto LAB_00178c31;
        cVar20._M_current = iVar13._M_current + -1;
        bVar24 = true;
        bVar17 = false;
        psVar14 = outNodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        bVar24 = (byte)(NVar15 - Break) < 4;
        if (bVar22) {
          std::__cxx11::string::string
                    ((string *)&local_e8,"expected \"catch\" or \"finally\"",(allocator *)&local_108
                    );
          local_68._M_dataplus._M_p = (pointer)0x0;
          local_68._M_string_length = 0;
          local_68.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtLine
                    ((ParserContext *)local_a8,Error,&peVar2->line,&local_e8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68);
          goto LAB_00178c0c;
        }
        bVar17 = false;
        bVar22 = false;
      }
    }
    cVar20._M_current = cVar20._M_current + 1;
  } while( true );
}

Assistant:

void structureInnerNode(IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Grouped);

	ParserContext ct(nullptr, errorReceiver, sTable);
	unsigned expectedIndents = (node->line ? node->line->indents + 1 : 0);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto it = node->blockNodes.cbegin(); it != node->blockNodes.cend(); ) {
		auto& n = *it;

		if (n->line->indents != expectedIndents) {
			ct.errorAtToken(ErrorLevel::Error, n->line->tokens[0],
					"indent mismatch. Expected ${0} indents but ${1} indents found",
					{std::to_string(expectedIndents), std::to_string(n->line->indents)});
			outNodes.clear();
			break;
		}

		if (n->line->tokens[0].type == TokenType::Name) {
			// Look ahead 3 tokens to find "label : loop", "def operator" or "else if" pattern
			auto itForward = it;
			size_t tokenIndex = 0;

			auto token0 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token1 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token2 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);

			auto keyToken = token0;
			StringId labelName = StringId::Invalid;
			if (token2 != nullptr && !lineTypes.count(token0->sid)
					&& matches(*token1, StringId::Colon) && matches(*token2, TokenType::Name)) {
				keyToken = token2;
				labelName = token0->sid;
			}

			auto itType = lineTypes.find(keyToken->sid);
			if (itType != lineTypes.end()) {
				auto const& attr = itType->second;
				it = combineWrappedLines(it, node->blockNodes.cend(), attr.hasBlock);

				if (token2 != nullptr && labelName != StringId::Invalid) {
					if (n->tokens.size() < 3 || token2 != n->tokens[2]) {
						ct.errorAtToken(ErrorLevel::Error, *token2, "this line seems to be part of wrapping line, but indents may be incorrect", {});
						// Skip few lines which is considered as part of wrapping line
						it = (itForward == node->blockNodes.cend() || tokenIndex == 0 ? itForward : itForward + 1);
						continue;
					}
					if (attr.type != NodeType::For && attr.type != NodeType::While) {
						ct.errorAtToken(ErrorLevel::Error, *token2, R"(only "for" or "while" can take label)", {});
						continue;
					}
					n->sid = labelName;
				}

				// Check whether sentence is correctly placed
				if (std::find(attr.parentType.cbegin(), attr.parentType.cend(), node->type) == attr.parentType.cend()) {
					ct.errorAtToken(ErrorLevel::Error, *keyToken,
							std::string("statement \"") + ct.getSt()->ref(keyToken->sid) + "\" is not allowed here", {});
					continue;
				}

				n->type = attr.type;
				if (n->type == NodeType::Def && token1 != nullptr && matches(*token1, StringId::Operator))
					n->type = NodeType::DefOperator;
				if (n->type == NodeType::Else && token1 != nullptr && matches(*token1, StringId::If))
					n->type = NodeType::ElseIf;

				if (attr.hasBlock) {
					for (; it != node->blockNodes.cend() && expectedIndents < (*it)->line->indents; it++)
						n->blockNodes.push_back(*it);
				}

				outNodes.push_back(n);
				continue;
			}
		}

		it = combineWrappedLines(it, node->blockNodes.cend(), false);

		if (std::find(expressionParentType.cbegin(), expressionParentType.cend(), node->type) == expressionParentType.cend()) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "expression is not allowed here", {});
			continue;
		}

		n->type = NodeType::Expression;
		outNodes.push_back(n);
	}

	// Check empty block
	if (runnableContainerNodeTypes.count(node->type) != 0) {
		bool runnableNodeFound = false;
		for (auto& n : outNodes) {
			if (runnableNodeTypes.count(n->type) != 0) {
				runnableNodeFound = true;
				break;
			}
		}
		if (!runnableNodeFound)
			ct.errorAtLine(ErrorLevel::Warning, node->line, "empty block statement", {});
	}

	// Check order of Catch/Finally and unreachable code
	bool catchFinallyFound = false;
	bool finallyFound = false;
	bool left = false;
	for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
		auto& n = *it;
		if (finallyFound) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "nothing can be placed after \"finally\" block", {});
			outNodes.erase(it, outNodes.cend());
			break;
		}

		if (n->type == NodeType::Catch)
			catchFinallyFound = true;
		else if (n->type == NodeType::Finally) {
			catchFinallyFound = true;
			finallyFound = true;
		}
		else {
			if (left) {
				ct.errorAtLine(ErrorLevel::Warning, n->line, "unreachable code", {});
				it = outNodes.erase(it, std::find_if(it, outNodes.cend(), [](const std::shared_ptr<Node>& n) {
					return n->type == NodeType::Catch || n->type == NodeType::Finally; }));
				if (it == outNodes.cend())
					break;
				it--;
				continue;
			}

			switch (n->type) {
			case NodeType::Break:
			case NodeType::Continue:
			case NodeType::Return:
			case NodeType::Throw:
				left = true;
				break;
			default:
				break;
			}

			if (catchFinallyFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(expected "catch" or "finally")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Check order of Case/Default
	if (node->type == NodeType::Switch) {
		bool defaultFound = false;
		for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
			auto& n = *it;
			if (n->type == NodeType::Default)
				defaultFound = true;
			else if (n->type == NodeType::Case && defaultFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"("case" cannot be placed after "default")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Copy outNodes to node->blockNodes with grouping IfGroup
	node->blockNodes.clear();
	for (auto& n : outNodes) {
		switch (n->type) {
		case NodeType::Sync:
			if (!recursive)
				structureInnerNode(errorReceiver, sTable, n.get(), false);
			node->blockNodes.push_back(n);
			break;

		case NodeType::If: {
			auto& nGroup = addNode(node->blockNodes, nullptr, NodeType::IfGroup);
			nGroup->blockNodes.push_back(n);
			nGroup->blockNodesState = NodeState::Structured;
			break;
		}

		case NodeType::ElseIf:
		case NodeType::Else: {
			if (node->blockNodes.empty() || node->blockNodes.back()->type != NodeType::IfGroup) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(unexpected "else" statement)", {});
				continue;
			}
			auto& nGroup = node->blockNodes.back();
			if (nGroup->blockNodes.back()->type == NodeType::Else) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(extra "else" statement)", {});
				continue;
			}
			nGroup->blockNodes.push_back(n);
			break;
		}

		default:
			node->blockNodes.push_back(n);
			break;
		}
	}

	if (recursive) {
		for (auto& n : node->blockNodes)
			recursiveStructureNodes(errorReceiver, sTable, n.get());
	}

	node->blockNodesState = NodeState::Structured;
}